

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_invalidModelWithTextInAllElements_Test::~Parser_invalidModelWithTextInAllElements_Test
          (Parser_invalidModelWithTextInAllElements_Test *this)

{
  Parser_invalidModelWithTextInAllElements_Test *this_local;
  
  ~Parser_invalidModelWithTextInAllElements_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, invalidModelWithTextInAllElements)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"starwars\">\n"
        "  episode7\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"sith.xml\">\n"
        "    kylo\n"
        "  </import>\n"
        "  <units name=\"robot\">\n"
        "    bb-8\n"
        "    <unit units=\"ball\">\n"
        "      rolls\n"
        "    </unit>\n"
        "    <unit units=\"bat\">\n"
        "        \n"
        "    </unit>\n"
        "  </units>\n"
        "  <component name=\"ship\">\n"
        "    falcon\n"
        "    <variable name=\"jedi\" units=\"robot\">\n"
        "      rey\n"
        "    </variable>\n"
        "    <reset variable=\"jedi\" test_variable=\"jedi\" order=\"3\">\n"
        "      boba fet\n"
        "      <test_value>\n"
        "      boba fet\n"
        "      <math/>\n"
        "      </test_value>\n"
        "      <reset_value>\n"
        "      boba fet\n"
        "      <math/>\n"
        "      </reset_value>\n"
        "    </reset>\n"
        "  </component>\n"
        "  <connection component_1=\"\" component_2=\"\">\n"
        "    finn\n"
        "    <map_variables variable_1=\"\" variable_2=\"\">\n"
        "      trooper\n"
        "    </map_variables>\n"
        "  </connection>\n"
        "  <encapsulation>\n"
        "    awakens\n"
        "    <component_ref component=\"ship\">\n"
        "      force\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";

    const std::vector<std::string> expectedIssues = {
        "Model 'starwars' has an invalid non-whitespace child text element '\n  episode7\n  '.",
        "Import from 'sith.xml' has an invalid non-whitespace child text element '\n    kylo\n  '.",
        "Units 'robot' has an invalid non-whitespace child text element '\n    bb-8\n    '.",
        "Unit referencing 'ball' in units 'robot' has an invalid non-whitespace child text element '\n      rolls\n    '.",
        "Component 'ship' has an invalid non-whitespace child text element '\n    falcon\n    '.",
        "Variable 'jedi' has an invalid non-whitespace child text element '\n      rey\n    '.",
        "Reset has an invalid non-whitespace child text element '\n      boba fet\n      '. Either a test_value block or a reset_value block is expected.",
        "test_value has an invalid non-whitespace child text element '\n      boba fet\n      '.",
        "The test_value in the reset in component 'ship' referencing variable 'jedi' and test_variable 'jedi' should have a MathML block as a child.",
        "reset_value has an invalid non-whitespace child text element '\n      boba fet\n      '.",
        "The reset_value in the reset in component 'ship' referencing variable 'jedi' and test_variable 'jedi' should have a MathML block as a child.",
        "Encapsulation in model 'starwars' has an invalid non-whitespace child text element '\n    awakens\n    '.",
        "Encapsulation in model 'starwars' has an invalid non-whitespace child text element '\n      force\n    '.",
        "Encapsulation in model 'starwars' specifies 'ship' as a parent component_ref but it does not have any children.",
        "Connection in model 'starwars' does not have a valid component_1 in a connection element.",
        "Connection in model 'starwars' does not have a valid component_2 in a connection element.",
        "Connection in model 'starwars' has an invalid non-whitespace child text element '\n    finn\n    '.",
        "Connection in model 'starwars' has an invalid non-whitespace child text element '\n      trooper\n    '.",
        "Connection in model 'starwars' does not have a valid variable_1 in a map_variables element.",
        "Connection in model 'starwars' does not have a valid variable_2 in a map_variables element.",
        "Connection in model 'starwars' specifies '' as variable_1 but the corresponding component_1 is invalid.",
        "Connection in model 'starwars' specifies '' as variable_2 but the corresponding component_2 is invalid.",
    };

    // Parse and check for CellML issues.
    libcellml::ParserPtr parser = libcellml::Parser::create();
    parser->parseModel(in);
    EXPECT_EQ_ISSUES(expectedIssues, parser);
}